

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::GoniometricLight::Phi(GoniometricLight *this,SampledWavelengths *lambda)

{
  Float a;
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar17 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  SampledSpectrum SVar25;
  Float local_e8;
  SampledSpectrum local_b0;
  SampledSpectrum local_a0;
  SampledSpectrum local_90;
  SampledSpectrum local_80;
  SampledSpectrum local_70;
  undefined1 local_60 [3] [16];
  undefined1 extraout_var [60];
  
  TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  TVar7.x = 0;
  TVar7.y = 0;
  uVar2 = TVar6.x;
  uVar3 = TVar6.y;
  local_e8 = 0.0;
  for (uVar5 = 0; auVar24 = in_ZMM1._8_56_, uVar5 != (~((int)uVar3 >> 0x1f) & uVar3);
      uVar5 = uVar5 + 1) {
    fVar9 = sinf((((float)(int)uVar5 + 0.5) * 3.1415927) / (float)(int)uVar3);
    uVar4 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
    TVar6 = TVar7;
    while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
      Image::GetChannels((ImageChannelValues *)local_60,&this->image,(Point2i)TVar6,
                         (array<pbrt::WrapMode,_2>)
                         *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
      auVar10._0_4_ = ImageChannelValues::Average((ImageChannelValues *)local_60);
      auVar10._4_60_ = extraout_var;
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_e8),auVar10._0_16_,ZEXT416((uint)fVar9));
      in_ZMM1 = ZEXT1664(auVar1);
      local_e8 = auVar1._0_4_;
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_60);
      TVar6 = (Tuple2<pbrt::Point2,_int>)((long)TVar6 + 1);
    }
    TVar7 = (Tuple2<pbrt::Point2,_int>)((long)TVar7 + 0x100000000);
  }
  a = this->scale;
  auVar17 = (undefined1  [56])0x0;
  SVar25 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar18._0_8_ = SVar25.values.values._8_8_;
  auVar18._8_56_ = auVar24;
  auVar11._0_8_ = SVar25.values.values._0_8_;
  auVar11._8_56_ = auVar17;
  local_b0.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar18._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&local_b0,a);
  auVar19._0_8_ = SVar25.values.values._8_8_;
  auVar19._8_56_ = auVar24;
  auVar12._0_8_ = SVar25.values.values._0_8_;
  auVar12._8_56_ = auVar17;
  local_a0.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar19._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&local_a0,2.0);
  auVar20._0_8_ = SVar25.values.values._8_8_;
  auVar20._8_56_ = auVar24;
  auVar13._0_8_ = SVar25.values.values._0_8_;
  auVar13._8_56_ = auVar17;
  local_90.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&local_90,3.1415927);
  auVar21._0_8_ = SVar25.values.values._8_8_;
  auVar21._8_56_ = auVar24;
  auVar14._0_8_ = SVar25.values.values._0_8_;
  auVar14._8_56_ = auVar17;
  local_80.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&local_80,3.1415927);
  auVar22._0_8_ = SVar25.values.values._8_8_;
  auVar22._8_56_ = auVar24;
  auVar15._0_8_ = SVar25.values.values._0_8_;
  auVar15._8_56_ = auVar17;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar22._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&local_70,local_e8);
  auVar23._0_8_ = SVar25.values.values._8_8_;
  auVar23._8_56_ = auVar24;
  auVar16._0_8_ = SVar25.values.values._0_8_;
  auVar16._8_56_ = auVar17;
  local_60[0] = vmovlhps_avx(auVar16._0_16_,auVar23._0_16_);
  SVar25 = SampledSpectrum::operator/((SampledSpectrum *)local_60,(float)(int)(uVar3 * uVar2));
  return (array<float,_4>)(array<float,_4>)SVar25;
}

Assistant:

SampledSpectrum GoniometricLight::Phi(const SampledWavelengths &lambda) const {
    // integrate over speherical coordinates [0,Pi], [0,2pi]
    Float sumY = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
    }
    return scale * I.Sample(lambda) * 2 * Pi * Pi * sumY / (width * height);
}